

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledCopyPixels.cpp
# Opt level: O3

void anon_unknown.dwarf_2d1d47::fillPixels(Array2D<half> *ph,int width,int height)

{
  long lVar1;
  half *phVar2;
  double dVar3;
  double dVar4;
  unsigned_short uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  float i;
  
  if (0 < height) {
    lVar7 = 0;
    uVar8 = 0;
    do {
      if (0 < width) {
        uVar6 = 0;
        do {
          dVar3 = sin((double)(int)uVar6);
          dVar4 = sin((double)(int)uVar8 * 0.5);
          i = (float)(dVar4 + dVar3);
          lVar1 = ph->_sizeY;
          phVar2 = ph->_data;
          if ((i != 0.0) || (NAN(i))) {
            if (half::_eLut[(uint)i >> 0x17] == 0) {
              uVar5 = half::convert((int)i);
            }
            else {
              uVar5 = half::_eLut[(uint)i >> 0x17] +
                      (short)(((uint)i & 0x7fffff) + 0xfff + (uint)(((uint)i >> 0xd & 1) != 0) >>
                             0xd);
            }
          }
          else {
            uVar5 = (unsigned_short)((uint)i >> 0x10);
          }
          *(unsigned_short *)((long)&phVar2[uVar6]._h + lVar1 * lVar7) = uVar5;
          uVar6 = uVar6 + 1;
        } while ((uint)width != uVar6);
      }
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 2;
    } while (uVar8 != (uint)height);
  }
  return;
}

Assistant:

void
fillPixels (Array2D<half> &ph, int width, int height)
{
    for (int y = 0; y < height; ++y)
	for (int x = 0; x < width; ++x)
	    ph[y][x] = sin (double (x)) + sin (y * 0.5);
}